

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QDnsServiceRecord __thiscall
QList<QDnsServiceRecord>::takeAt(QList<QDnsServiceRecord> *this,qsizetype i)

{
  pointer pQVar1;
  char *in_RDX;
  
  (this->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = data((QList<QDnsServiceRecord> *)i);
  QDnsServiceRecord::QDnsServiceRecord((QDnsServiceRecord *)this,pQVar1 + (long)in_RDX);
  remove((QList<QDnsServiceRecord> *)i,in_RDX);
  return (QSharedDataPointer<QDnsServiceRecordPrivate>)
         (QSharedDataPointer<QDnsServiceRecordPrivate>)this;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }